

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseMaps.h
# Opt level: O0

void __thiscall
tonk::
LightHashMap<asio::ip::basic_endpoint<asio::ip::udp>,_tonk::IConnection_*,_tonk::UDPAddressHasher>::
rehash(LightHashMap<asio::ip::basic_endpoint<asio::ip::udp>,_tonk::IConnection_*,_tonk::UDPAddressHasher>
       *this,uint new_hash_size)

{
  uint uVar1;
  int iVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  ulong *puVar6;
  raw_node *prVar7;
  uint in_ESI;
  int *in_RDI;
  ulong uVar8;
  node *pNode;
  uint i;
  uint bitIndex;
  uint old_num_valid;
  uint old_values_count;
  raw_node *old_values;
  raw_node *local_a0;
  node *in_stack_ffffffffffffff68;
  raw_node *prVar9;
  LightHashMap<asio::ip::basic_endpoint<asio::ip::udp>,_tonk::IConnection_*,_tonk::UDPAddressHasher>
  *in_stack_ffffffffffffff70;
  raw_node *local_70;
  uint local_3c;
  
  if (((uint)in_RDI[2] <= in_ESI) && (in_ESI != in_RDI[6])) {
    prVar9 = *(raw_node **)(in_RDI + 4);
    uVar1 = in_RDI[6];
    iVar2 = in_RDI[2];
    uVar4 = CONCAT44(0,in_ESI);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar4;
    uVar5 = SUB168(auVar3 * ZEXT816(0x30),0);
    uVar8 = uVar5 + 8;
    if (SUB168(auVar3 * ZEXT816(0x30),8) != 0 || 0xfffffffffffffff7 < uVar5) {
      uVar8 = 0xffffffffffffffff;
    }
    puVar6 = (ulong *)operator_new__(uVar8);
    *puVar6 = uVar4;
    prVar7 = (raw_node *)(puVar6 + 1);
    if (uVar4 != 0) {
      local_70 = prVar7;
      do {
        raw_node::raw_node(local_70);
        local_70 = local_70 + 1;
      } while (local_70 != prVar7 + uVar4);
    }
    *(raw_node **)(in_RDI + 4) = prVar7;
    in_RDI[6] = in_ESI;
    in_RDI[2] = 0;
    *in_RDI = 0x20 - (0x1f - LZCOUNT(in_ESI));
    local_3c = 0;
    while ((local_3c < uVar1 &&
           ((prVar9[local_3c].m_bits[0x28] == '\0' ||
            (move_into(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68), iVar2 != in_RDI[2])))))
    {
      local_3c = local_3c + 1;
    }
    in_RDI[3] = in_ESI + 1 >> 1;
    if (prVar9 != (raw_node *)0x0) {
      prVar7 = prVar9 + -1;
      local_a0 = prVar9 + *(long *)(prVar9[-1].m_bits + 0x28);
      if (prVar9 != local_a0) {
        do {
          local_a0 = local_a0 + -1;
          raw_node::~raw_node(local_a0);
        } while (local_a0 != prVar9);
      }
      operator_delete__(prVar7->m_bits + 0x28);
    }
  }
  return;
}

Assistant:

inline void rehash(unsigned new_hash_size)
    {
        TONK_DEBUG_ASSERT(new_hash_size >= m_num_valid);
        TONK_DEBUG_ASSERT((new_hash_size & (new_hash_size - 1)) == 0); // ispow2

        if ((new_hash_size < m_num_valid) ||
            (new_hash_size == m_values_count))
        {
            return;
        }

        raw_node* old_values = m_values;
        const unsigned old_values_count = m_values_count;
        const unsigned old_num_valid = m_num_valid;

        m_values = new raw_node[new_hash_size];
        m_values_count = new_hash_size;

        m_num_valid = 0;
        const unsigned bitIndex = NonzeroLowestBitIndex(new_hash_size);
        m_hash_shift = 32 - bitIndex;
        TONK_DEBUG_ASSERT(new_hash_size == (1U << (32 - m_hash_shift)));

        for (unsigned i = 0; i < old_values_count; ++i)
        {
            node* pNode = reinterpret_cast<node*>( old_values + i );

            if (pNode->state)
            {
                move_into(pNode);

                if (old_num_valid == m_num_valid) {
                    break;
                }
            }
        }

        m_grow_threshold = (new_hash_size + 1) >> 1;

        delete[] old_values;
    }